

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemIOCallback.cpp
# Opt level: O0

void __thiscall libebml::MemIOCallback::~MemIOCallback(MemIOCallback *this)

{
  MemIOCallback *this_local;
  
  (this->super_IOCallback)._vptr_IOCallback = (_func_int **)&PTR__MemIOCallback_00237030;
  if (this->dataBuffer != (binary *)0x0) {
    free(this->dataBuffer);
  }
  std::__cxx11::string::~string((string *)&this->mLastErrorStr);
  IOCallback::~IOCallback(&this->super_IOCallback);
  return;
}

Assistant:

MemIOCallback::~MemIOCallback()
{
  if (dataBuffer != NULL)
    free(dataBuffer);
}